

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O3

void __thiscall
TPZFrontNonSym<std::complex<float>_>::AddKel
          (TPZFrontNonSym<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *elmat,
          TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  _ComplexT _Var1;
  _ComplexT _Var2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  complex<float> *pcVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  lVar3 = sourceindex->fNElements;
  if (0 < lVar3) {
    lVar11 = 0;
    do {
      iVar8 = Local(this,destinationindex->fStore[lVar11]);
      lVar12 = 0;
      do {
        iVar9 = Local(this,destinationindex->fStore[lVar12]);
        lVar4 = sourceindex->fStore[lVar11];
        lVar5 = sourceindex->fStore[lVar12];
        lVar6 = (elmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
        if (((lVar4 < 0 || lVar6 <= lVar4) || (lVar5 < 0)) ||
           ((elmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar10 = (long)(this->super_TPZFront<std::complex<float>_>).fMaxFront * (long)iVar9;
        pcVar7 = (this->super_TPZFront<std::complex<float>_>).fData.fStore;
        _Var1 = elmat->fElem[lVar6 * lVar5 + lVar4]._M_value;
        _Var2 = pcVar7[lVar10 + iVar8]._M_value;
        pcVar7[lVar10 + iVar8]._M_value =
             CONCAT44((float)(_Var2 >> 0x20) + (float)(_Var1 >> 0x20),(float)_Var2 + (float)_Var1);
        lVar12 = lVar12 + 1;
      } while (lVar3 != lVar12);
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar3);
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &sourceindex,  TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel=sourceindex.NElements();
	for (i = 0; i < nel; i++) {
		// message #1.1.1 to this:TPZFront
		ilocal = this->Local(destinationindex[i]);
		for (j = 0; j < nel; j++) {
			// message #1.1.2.1 to this:TPZFront
			jlocal = this->Local(destinationindex[j]);
			
			// message #1.1.2.2 to this:TPZFront
			this->Element(ilocal, jlocal)+=elmat(sourceindex[i],sourceindex[j]);
		}
	}
}